

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void mcbsp_get(mcbsp_pid_t pid,void *src,mcbsp_size_t offset,void *dst,mcbsp_size_t size)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  Memslot slot;
  Memblock *pMVar4;
  Memblock src_slot;
  Memslot src_slot_id;
  mcbsp_size_t size_local;
  void *dst_local;
  mcbsp_size_t offset_local;
  void *src_local;
  mcbsp_pid_t pid_local;
  
  if ((s_spmd == (Spmd *)0x0) || (bVar2 = bsplib::Spmd::closed(s_spmd), bVar2)) {
    bsp_abort("bsp_get: can only be called within SPMD section\n");
  }
  if (size != 0) {
    uVar3 = bsplib::Spmd::nprocs(s_spmd);
    if (uVar3 < pid) {
      bsp_abort("bsp_get: The source process ID does not exist\n");
    }
    if (src == (void *)0x0) {
      bsp_abort("bsp_get: Source address cannot be identified by NULL\n");
    }
    slot = lookup_usable_reg(src,"bsp_get");
    pMVar4 = bsplib::Rdma::slot(s_rdma,pid,slot);
    uVar1 = pMVar4->size;
    if (uVar1 < offset + size) {
      bsp_abort("bsp_get: Reads %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",
                (offset + size) - uVar1,pMVar4->addr,pMVar4->addr,uVar1,(ulong)pid);
    }
    bsplib::Rdma::get(s_rdma,pid,slot,offset,dst,size);
  }
  return;
}

Assistant:

void mcbsp_get( mcbsp_pid_t pid, const void * src,
    mcbsp_size_t offset, const void * dst, mcbsp_size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::GET, size );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_get: can only be called within SPMD section\n");

    if (size == 0) // ignore any empty reads
        return;

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_get: The source process ID does not exist\n");

    if ( src == NULL )
        bsp_abort("bsp_get: Source address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot src_slot_id = lookup_usable_reg( src, "bsp_get" );
    bsplib::Rdma::Memblock src_slot = s_rdma->slot( pid, src_slot_id );

    if ( size_t(offset + size ) > src_slot.size )
        bsp_abort("bsp_get: Reads %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + size - src_slot.size,
                  src_slot.addr, src_slot.addr, src_slot.size, pid );

    s_rdma->get( pid, src_slot_id , offset, const_cast<void*>(dst), size );
}